

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssertionExpr.cpp
# Opt level: O0

optional<slang::ast::SequenceRange> __thiscall
slang::ast::SequenceWithMatchExpr::computeSequenceLengthImpl(SequenceWithMatchExpr *this)

{
  _Optional_base<slang::ast::SequenceRange,_true,_true> _Var1;
  bool bVar2;
  SequenceRange *pSVar3;
  SequenceRange *in_RDI;
  optional<slang::ast::SequenceRange> oVar4;
  SequenceRange SVar5;
  optional<slang::ast::SequenceRange> res;
  AssertionExpr *in_stack_ffffffffffffffa0;
  uint32_t uVar6;
  _Optional_payload_base<unsigned_int> _Var7;
  undefined8 local_8;
  
  uVar6 = (uint32_t)((ulong)in_RDI >> 0x20);
  oVar4 = AssertionExpr::computeSequenceLength(in_stack_ffffffffffffffa0);
  _Var7 = oVar4.super__Optional_base<slang::ast::SequenceRange,_true,_true>._M_payload.
          super__Optional_payload_base<slang::ast::SequenceRange>._M_payload._0_8_;
  local_8 = oVar4.super__Optional_base<slang::ast::SequenceRange,_true,_true>._M_payload.
            super__Optional_payload_base<slang::ast::SequenceRange>._8_8_;
  bVar2 = std::optional::operator_cast_to_bool((optional<slang::ast::SequenceRange> *)0xec8650);
  if ((bVar2) &&
     (bVar2 = std::optional::operator_cast_to_bool
                        ((optional<slang::ast::SequenceRepetition> *)0xec8667), bVar2)) {
    std::optional<slang::ast::SequenceRepetition>::operator->
              ((optional<slang::ast::SequenceRepetition> *)0xec867b);
    pSVar3 = std::optional<slang::ast::SequenceRange>::operator*
                       ((optional<slang::ast::SequenceRange> *)0xec868a);
    SVar5.max.super__Optional_base<unsigned_int,_true,_true>._M_payload.
    super__Optional_payload_base<unsigned_int> =
         (_Optional_base<unsigned_int,_true,_true>)(_Optional_base<unsigned_int,_true,_true>)_Var7;
    SVar5.min = uVar6;
    SVar5 = SequenceRepetition::applyTo(*(SequenceRepetition **)pSVar3,SVar5);
    std::optional<slang::ast::SequenceRange>::operator=(SVar5._0_8_,in_RDI);
  }
  _Var1._M_payload.super__Optional_payload_base<slang::ast::SequenceRange>._8_8_ = local_8;
  _Var1._M_payload.super__Optional_payload_base<slang::ast::SequenceRange>._M_payload._0_4_ =
       _Var7._M_payload;
  _Var1._M_payload.super__Optional_payload_base<slang::ast::SequenceRange>._M_payload._4_1_ =
       _Var7._M_engaged;
  _Var1._M_payload.super__Optional_payload_base<slang::ast::SequenceRange>._M_payload._5_3_ =
       _Var7._5_3_;
  return (_Optional_base<slang::ast::SequenceRange,_true,_true>)
         (_Optional_base<slang::ast::SequenceRange,_true,_true>)
         _Var1._M_payload.super__Optional_payload_base<slang::ast::SequenceRange>;
}

Assistant:

std::optional<SequenceRange> SequenceWithMatchExpr::computeSequenceLengthImpl() const {
    auto res = expr.computeSequenceLength();
    if (res && repetition)
        res = repetition->applyTo(*res);
    return res;
}